

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonReturn(JsonNode *pNode,sqlite3_context *pCtx,sqlite3_value **aReplace)

{
  u32 uVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  int length;
  u32 uVar5;
  u32 uVar6;
  char *z_00;
  uint uVar7;
  u8 *puVar8;
  uint uVar9;
  u32 vlo;
  u32 v_1;
  char c;
  u32 j;
  char *zOut;
  char *z_2;
  u32 n;
  u32 i_1;
  char *z_1;
  double r;
  JsonNode *pJStack_30;
  uint v;
  char *z;
  sqlite3_int64 i;
  sqlite3_value **aReplace_local;
  sqlite3_context *pCtx_local;
  JsonNode *pNode_local;
  
  i = (sqlite3_int64)aReplace;
  aReplace_local = &pCtx->pOut;
  pCtx_local = (sqlite3_context *)pNode;
  switch(pNode->eType) {
  case '\x01':
    sqlite3_result_int(pCtx,1);
    return;
  case '\x02':
    sqlite3_result_int(pCtx,0);
    return;
  case '\x03':
    z = (char *)0x0;
    pJStack_30 = (pNode->u).pPatch;
    if (pJStack_30->eType == '-') {
      pJStack_30 = (JsonNode *)&pJStack_30->jnFlags;
    }
    do {
      bVar3 = false;
      if ('/' < (char)pJStack_30->eType) {
        bVar3 = (char)pJStack_30->eType < ':';
      }
      if (!bVar3) {
        if (*(pNode->u).zJContent == '-') {
          z = (char *)-(long)z;
        }
        sqlite3_result_int64(pCtx,(i64)z);
        return;
      }
      puVar8 = &pJStack_30->jnFlags;
      r._4_4_ = (int)(char)pJStack_30->eType - 0x30;
      pJStack_30 = (JsonNode *)puVar8;
      if (0xccccccccccccccb < (long)z) {
        if (((0xccccccccccccccc < (long)z) || (('/' < (char)*puVar8 && ((char)*puVar8 < ':')))) ||
           (r._4_4_ == 9)) goto switchD_0027562d_caseD_4;
        if (r._4_4_ == 8) break;
      }
      z = (char *)((long)z * 10 + (ulong)r._4_4_);
    } while( true );
  case '\x04':
    goto switchD_0027562d_caseD_4;
  case '\x05':
    if ((pNode->jnFlags & 2) == 0) {
      sqlite3_result_text(pCtx,(char *)&((pNode->u).pPatch)->jnFlags,pNode->n - 2,
                          (_func_void_void_ptr *)0xffffffffffffffff);
      return;
    }
    uVar1 = pNode->n;
    pcVar2 = (pNode->u).zJContent;
    z_00 = (char *)sqlite3_malloc(uVar1 + 1);
    if (z_00 == (char *)0x0) {
      sqlite3_result_error_nomem((sqlite3_context *)aReplace_local);
      return;
    }
    v_1 = 0;
    for (z_2._4_4_ = 1; z_2._4_4_ < uVar1 - 1; z_2._4_4_ = z_2._4_4_ + 1) {
      if (pcVar2[z_2._4_4_] == '\\') {
        uVar7 = z_2._4_4_ + 1;
        vlo._3_1_ = pcVar2[uVar7];
        if (vlo._3_1_ == 'u') {
          uVar5 = jsonHexToInt4(pcVar2 + (ulong)uVar7 + 1);
          uVar7 = z_2._4_4_ + 5;
          if (uVar5 == 0) break;
          bVar4 = (byte)uVar5;
          if (uVar5 < 0x80) {
            z_00[v_1] = bVar4;
            v_1 = v_1 + 1;
            z_2._4_4_ = uVar7;
          }
          else if (uVar5 < 0x800) {
            uVar9 = v_1 + 1;
            z_00[v_1] = (byte)(uVar5 >> 6) | 0xc0;
            v_1 = v_1 + 2;
            z_00[uVar9] = bVar4 & 0x3f | 0x80;
            z_2._4_4_ = uVar7;
          }
          else if (((((uVar5 & 0xfc00) == 0xd800) && (uVar7 < uVar1 - 6)) &&
                   (pcVar2[z_2._4_4_ + 6] == '\\')) &&
                  ((pcVar2[z_2._4_4_ + 7] == 'u' &&
                   (uVar6 = jsonHexToInt4(pcVar2 + (ulong)uVar7 + 3), (uVar6 & 0xfc00) == 0xdc00))))
          {
            uVar7 = (uVar5 & 0x3ff) * 0x400 + (uVar6 & 0x3ff) + 0x10000;
            z_00[v_1] = (byte)(uVar7 >> 0x12) | 0xf0;
            z_00[v_1 + 1] = (byte)(uVar7 >> 0xc) & 0x3f | 0x80;
            uVar9 = v_1 + 3;
            z_00[v_1 + 2] = (byte)(uVar7 >> 6) & 0x3f | 0x80;
            v_1 = v_1 + 4;
            z_00[uVar9] = (byte)uVar7 & 0x3f | 0x80;
            z_2._4_4_ = z_2._4_4_ + 0xb;
          }
          else {
            z_00[v_1] = (byte)(uVar5 >> 0xc) | 0xe0;
            uVar9 = v_1 + 2;
            z_00[v_1 + 1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
            v_1 = v_1 + 3;
            z_00[uVar9] = bVar4 & 0x3f | 0x80;
            z_2._4_4_ = uVar7;
          }
        }
        else {
          if (vlo._3_1_ == 'b') {
            vlo._3_1_ = '\b';
          }
          else if (vlo._3_1_ == 'f') {
            vlo._3_1_ = '\f';
          }
          else if (vlo._3_1_ == 'n') {
            vlo._3_1_ = '\n';
          }
          else if (vlo._3_1_ == 'r') {
            vlo._3_1_ = '\r';
          }
          else if (vlo._3_1_ == 't') {
            vlo._3_1_ = '\t';
          }
          z_00[v_1] = vlo._3_1_;
          v_1 = v_1 + 1;
          z_2._4_4_ = uVar7;
        }
      }
      else {
        z_00[v_1] = pcVar2[z_2._4_4_];
        v_1 = v_1 + 1;
      }
    }
    z_00[v_1] = '\0';
    sqlite3_result_text((sqlite3_context *)aReplace_local,z_00,v_1,sqlite3_free);
    return;
  case '\x06':
  case '\a':
    jsonReturnJson(pNode,pCtx,aReplace);
    return;
  default:
    sqlite3_result_null(pCtx);
    return;
  }
  if (*(pNode->u).zJContent == '-') {
    sqlite3_result_int64(pCtx,-0x8000000000000000);
    return;
  }
switchD_0027562d_caseD_4:
  pcVar2 = (pNode->u).zJContent;
  length = sqlite3Strlen30(pcVar2);
  sqlite3AtoF(pcVar2,(double *)&z_1,length,'\x01');
  sqlite3_result_double((sqlite3_context *)aReplace_local,(double)z_1);
  return;
}

Assistant:

static void jsonReturn(
  JsonNode *pNode,            /* Node to return */
  sqlite3_context *pCtx,      /* Return value for this function */
  sqlite3_value **aReplace    /* Array of replacement values */
){
  switch( pNode->eType ){
    default: {
      assert( pNode->eType==JSON_NULL );
      sqlite3_result_null(pCtx);
      break;
    }
    case JSON_TRUE: {
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSON_FALSE: {
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSON_INT: {
      sqlite3_int64 i = 0;
      const char *z;
      assert( pNode->eU==1 );
      z = pNode->u.zJContent;
      if( z[0]=='-' ){ z++; }
      while( z[0]>='0' && z[0]<='9' ){
        unsigned v = *(z++) - '0';
        if( i>=LARGEST_INT64/10 ){
          if( i>LARGEST_INT64/10 ) goto int_as_real;
          if( z[0]>='0' && z[0]<='9' ) goto int_as_real;
          if( v==9 ) goto int_as_real;
          if( v==8 ){
            if( pNode->u.zJContent[0]=='-' ){
              sqlite3_result_int64(pCtx, SMALLEST_INT64);
              goto int_done;
            }else{
              goto int_as_real;
            }
          }
        }
        i = i*10 + v;
      }
      if( pNode->u.zJContent[0]=='-' ){ i = -i; }
      sqlite3_result_int64(pCtx, i);
      int_done:
      break;
      int_as_real: ; /* no break */ deliberate_fall_through
    }
    case JSON_REAL: {
      double r;
#ifdef SQLITE_AMALGAMATION
      const char *z;
      assert( pNode->eU==1 );
      z = pNode->u.zJContent;
      sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
#else
      assert( pNode->eU==1 );
      r = strtod(pNode->u.zJContent, 0);
#endif
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSON_STRING: {
#if 0 /* Never happens because JNODE_RAW is only set by json_set(),
      ** json_insert() and json_replace() and those routines do not
      ** call jsonReturn() */
      if( pNode->jnFlags & JNODE_RAW ){
        assert( pNode->eU==1 );
        sqlite3_result_text(pCtx, pNode->u.zJContent, pNode->n,
                            SQLITE_TRANSIENT);
      }else
#endif
      assert( (pNode->jnFlags & JNODE_RAW)==0 );
      if( (pNode->jnFlags & JNODE_ESCAPE)==0 ){
        /* JSON formatted without any backslash-escapes */
        assert( pNode->eU==1 );
        sqlite3_result_text(pCtx, pNode->u.zJContent+1, pNode->n-2,
                            SQLITE_TRANSIENT);
      }else{
        /* Translate JSON formatted string into raw text */
        u32 i;
        u32 n = pNode->n;
        const char *z;
        char *zOut;
        u32 j;
        assert( pNode->eU==1 );
        z = pNode->u.zJContent;
        zOut = sqlite3_malloc( n+1 );
        if( zOut==0 ){
          sqlite3_result_error_nomem(pCtx);
          break;
        }
        for(i=1, j=0; i<n-1; i++){
          char c = z[i];
          if( c!='\\' ){
            zOut[j++] = c;
          }else{
            c = z[++i];
            if( c=='u' ){
              u32 v = jsonHexToInt4(z+i+1);
              i += 4;
              if( v==0 ) break;
              if( v<=0x7f ){
                zOut[j++] = (char)v;
              }else if( v<=0x7ff ){
                zOut[j++] = (char)(0xc0 | (v>>6));
                zOut[j++] = 0x80 | (v&0x3f);
              }else{
                u32 vlo;
                if( (v&0xfc00)==0xd800
                  && i<n-6
                  && z[i+1]=='\\'
                  && z[i+2]=='u'
                  && ((vlo = jsonHexToInt4(z+i+3))&0xfc00)==0xdc00
                ){
                  /* We have a surrogate pair */
                  v = ((v&0x3ff)<<10) + (vlo&0x3ff) + 0x10000;
                  i += 6;
                  zOut[j++] = 0xf0 | (v>>18);
                  zOut[j++] = 0x80 | ((v>>12)&0x3f);
                  zOut[j++] = 0x80 | ((v>>6)&0x3f);
                  zOut[j++] = 0x80 | (v&0x3f);
                }else{
                  zOut[j++] = 0xe0 | (v>>12);
                  zOut[j++] = 0x80 | ((v>>6)&0x3f);
                  zOut[j++] = 0x80 | (v&0x3f);
                }
              }
            }else{
              if( c=='b' ){
                c = '\b';
              }else if( c=='f' ){
                c = '\f';
              }else if( c=='n' ){
                c = '\n';
              }else if( c=='r' ){
                c = '\r';
              }else if( c=='t' ){
                c = '\t';
              }
              zOut[j++] = c;
            }
          }
        }
        zOut[j] = 0;
        sqlite3_result_text(pCtx, zOut, j, sqlite3_free);
      }
      break;
    }
    case JSON_ARRAY:
    case JSON_OBJECT: {
      jsonReturnJson(pNode, pCtx, aReplace);
      break;
    }
  }
}